

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int Data_Entry(FORM *form,int c)

{
  FIELD *field;
  _Bool _Var1;
  int iVar2;
  
  field = form->current;
  if ((~field->opts & 10U) != 0) {
    return -0xc;
  }
  if (((((field->opts & 0x20U) != 0) && (form->currow == 0)) && (form->curcol == 0)) &&
     ((form->status & 0x30) == 0)) {
    werase(form->w);
  }
  if ((form->status & 4) == 0) {
    _Var1 = Is_There_Room_For_A_Char_In_Line(form);
    if (!_Var1) {
      if ((int)field->rows + field->nrow != 1) {
        return -0xc;
      }
      if ((field->status & 8) == 0) {
        return -0xc;
      }
      _Var1 = Field_Grown(field,1);
      if (!_Var1) {
        return -1;
      }
    }
    winsch(form->w,c);
  }
  else {
    waddch(form->w,c);
  }
  iVar2 = Wrapping_Not_Necessary_Or_Wrapping_Ok(form);
  if (iVar2 == 0) {
    if (field->drows + -1 == form->currow) {
      iVar2 = field->dcols;
      form->status = form->status | 0x10;
      if (iVar2 + -1 == form->curcol) {
        if ((field->status & 8) == 0) {
          if ((field->opts & 0x40) != 0) {
            iVar2 = Inter_Field_Navigation(FN_Next_Field,form);
            return iVar2;
          }
        }
        else {
          _Var1 = Field_Grown(field,1);
          if (!_Var1) {
            return -1;
          }
        }
      }
    }
    else {
      *(byte *)&form->status = (byte)form->status | 0x10;
    }
    IFN_Next_Character(form);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int Data_Entry(FORM * form, int c)
{
  FIELD  *field = form->current;
  int result = E_REQUEST_DENIED;

  if ( (field->opts & O_EDIT) 
#if FIX_FORM_INACTIVE_BUG
       && (field->opts & O_ACTIVE) 
#endif
       )
    {
      if ( (field->opts & O_BLANK) &&
           First_Position_In_Current_Field(form) &&
           !(form->status & _FCHECK_REQUIRED) && 
           !(form->status & _WINDOW_MODIFIED) )
        werase(form->w);

      if (form->status & _OVLMODE)
        {
          waddch(form->w,(chtype)c);
        } 
      else /* no _OVLMODE */ 
        {
          bool There_Is_Room = Is_There_Room_For_A_Char_In_Line(form);

          if (!(There_Is_Room ||
                ((Single_Line_Field(field) && Growable(field)))))
              return E_REQUEST_DENIED;

          if (!There_Is_Room && !Field_Grown(field,1))
            return E_SYSTEM_ERROR;

          winsch(form->w,(chtype)c);
        }

      if ((result=Wrapping_Not_Necessary_Or_Wrapping_Ok(form))==E_OK)
        {
          bool End_Of_Field= (((field->drows-1)==form->currow) &&
                              ((field->dcols-1)==form->curcol));
          form->status |= _WINDOW_MODIFIED;
          if (End_Of_Field && !Growable(field) && (field->opts & O_AUTOSKIP))
            result = Inter_Field_Navigation(FN_Next_Field,form);
          else
            {
              if (End_Of_Field && Growable(field) && !Field_Grown(field,1))
                result = E_SYSTEM_ERROR;
              else
                {
                  IFN_Next_Character(form);
                  result = E_OK;
                }
            }
        }
    }
  return result;
}